

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O3

int ncnn::binary_op_no_broadcast<ncnn::binary_op_pow>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long extraout_RAX;
  ulong uVar9;
  long lVar10;
  void *pvVar11;
  void *pvVar12;
  uint uVar13;
  void *pvVar14;
  float fVar15;
  long lVar8;
  
  iVar5 = a->c;
  lVar6 = (long)iVar5;
  if (0 < lVar6) {
    uVar13 = a->h * a->w * a->d;
    pvVar14 = a->data;
    pvVar12 = b->data;
    sVar1 = b->cstep;
    sVar2 = c->cstep;
    sVar3 = c->elemsize;
    sVar4 = b->elemsize;
    pvVar11 = c->data;
    lVar7 = a->cstep * a->elemsize;
    lVar10 = 0;
    lVar8 = lVar7;
    do {
      if (0 < (int)uVar13) {
        uVar9 = 0;
        do {
          fVar15 = powf(*(float *)((long)pvVar14 + uVar9 * 4),*(float *)((long)pvVar12 + uVar9 * 4))
          ;
          *(float *)((long)pvVar11 + uVar9 * 4) = fVar15;
          uVar9 = uVar9 + 1;
          lVar8 = extraout_RAX;
        } while (uVar13 != uVar9);
      }
      iVar5 = (int)lVar8;
      lVar10 = lVar10 + 1;
      pvVar11 = (void *)((long)pvVar11 + sVar2 * sVar3);
      pvVar12 = (void *)((long)pvVar12 + sVar1 * sVar4);
      pvVar14 = (void *)((long)pvVar14 + lVar7);
    } while (lVar10 != lVar6);
  }
  return iVar5;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int channels = a.c;
    int size = a.w * a.h * a.d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        for (int i = 0; i < size; i++)
        {
            outptr[i] = op(ptr[i], ptr1[i]);
        }
    }

    return 0;
}